

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_rkv.c
# Opt level: O2

MPP_RET hal_vp9d_rkv_wait(void *hal,HalTaskInfo *task)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  MPP_RET MVar4;
  long *plVar5;
  void *buf;
  ulong uVar6;
  MppFrame mframe;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if (*(int *)((long)hal + 0x38) == 0) {
    plVar5 = (long *)(lVar1 + 0xe0);
  }
  else {
    plVar5 = (long *)((long)(task->dec).reg_index * 0x40 + lVar1 + 0x30);
  }
  lVar2 = *plVar5;
  if (lVar2 == 0) {
    _mpp_log_l(2,"hal_vp9d_rkv","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
               "hal_vp9d_rkv_wait",0x252);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  MVar4 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0x10,(void *)0x0);
  if (MVar4 != MPP_OK) {
    _mpp_log_l(2,"hal_vp9d_rkv","poll cmd failed %d\n","hal_vp9d_rkv_wait",(ulong)(uint)MVar4);
  }
  if (((byte)hal_vp9d_debug & 4) != 0) {
    for (uVar6 = 0; (int)uVar6 != 0x4e; uVar6 = uVar6 + 1) {
      _mpp_log_l(4,"hal_vp9d_rkv","get regs[%02d]: %08X\n",(char *)0x0,uVar6 & 0xffffffff,
                 (ulong)*(uint *)(lVar2 + uVar6 * 4));
    }
  }
  if ((((ulong)(task->dec).flags & 0xc) != 0) || ((*(byte *)(lVar2 + 5) & 0x10) == 0)) {
    mframe = (MppFrame)0x0;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x18),(task->dec).output,SLOT_FRAME_PTR,&mframe);
    mpp_frame_set_errinfo(mframe,1);
  }
  if ((*(long *)((long)hal + 0x30) != 0) && (((ulong)(task->dec).flags & 0x20) != 0)) {
    pvVar3 = (task->dec).syntax.data;
    mpp_buffer_sync_begin_f(*(MppBuffer *)(lVar1 + 200),1,"hal_vp9d_rkv_wait");
    buf = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 200),"hal_vp9d_rkv_wait");
    hal_vp9d_update_counts(buf,(task->dec).syntax.data);
    mpp_callback_f("hal_vp9d_rkv_wait",*(MppCbCtx **)((long)hal + 0x30),
                   (void *)((long)pvVar3 + 0x8c8));
  }
  if (*(int *)((long)hal + 0x38) != 0) {
    *(undefined4 *)(lVar1 + (long)(task->dec).reg_index * 0x40) = 0;
  }
  return MVar4;
}

Assistant:

MPP_RET hal_vp9d_rkv_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx *)hal;
    Vp9dRkvCtx *hw_ctx = (Vp9dRkvCtx*)p_hal->hw_ctx;
    VP9_REGS *hw_regs = (VP9_REGS *)hw_ctx->hw_regs;

    if (p_hal->fast_mode)
        hw_regs = (VP9_REGS *)hw_ctx->g_buf[task->dec.reg_index].hw_regs;

    mpp_assert(hw_regs);

    ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    if (hal_vp9d_debug & HAL_VP9D_DBG_REG) {
        RK_U32 *p = (RK_U32 *)hw_regs;
        RK_U32 i = 0;

        for (i = 0; i < sizeof(VP9_REGS) / 4; i++)
            mpp_log("get regs[%02d]: %08X\n", i, *p++);
    }

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err ||
        !hw_regs->swreg1_int.sw_dec_rdy_sta) {
        MppFrame mframe = NULL;
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
        mpp_frame_set_errinfo(mframe, 1);
    }

    if (p_hal->dec_cb && task->dec.flags.wait_done) {
        DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)task->dec.syntax.data;

        mpp_buffer_sync_ro_begin(hw_ctx->count_base);
        hal_vp9d_update_counts(mpp_buffer_get_ptr(hw_ctx->count_base), task->dec.syntax.data);

        mpp_callback(p_hal->dec_cb, &pic_param->counts);
    }
    if (p_hal->fast_mode) {
        hw_ctx->g_buf[task->dec.reg_index].use_flag = 0;
    }

    (void)task;
    return ret;
}